

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-opcnt.cc
# Opt level: O0

bool wabt::operator<(OpcodeInfo *lhs,OpcodeInfo *rhs)

{
  bool bVar1;
  Enum EVar2;
  Enum EVar3;
  OpcodeInfo *rhs_local;
  OpcodeInfo *lhs_local;
  
  EVar2 = Opcode::operator_cast_to_Enum(&lhs->opcode_);
  EVar3 = Opcode::operator_cast_to_Enum(&rhs->opcode_);
  if (EVar2 < EVar3) {
    lhs_local._7_1_ = true;
  }
  else {
    EVar2 = Opcode::operator_cast_to_Enum(&lhs->opcode_);
    EVar3 = Opcode::operator_cast_to_Enum(&rhs->opcode_);
    if (EVar3 < EVar2) {
      lhs_local._7_1_ = false;
    }
    else if ((int)lhs->kind_ < (int)rhs->kind_) {
      lhs_local._7_1_ = true;
    }
    else if ((int)rhs->kind_ < (int)lhs->kind_) {
      lhs_local._7_1_ = false;
    }
    else {
      bVar1 = std::operator<(&lhs->data_,&rhs->data_);
      if (bVar1) {
        lhs_local._7_1_ = true;
      }
      else {
        bVar1 = std::operator>(&lhs->data_,&rhs->data_);
        if (bVar1) {
          lhs_local._7_1_ = false;
        }
        else {
          lhs_local._7_1_ = false;
        }
      }
    }
  }
  return lhs_local._7_1_;
}

Assistant:

bool operator<(const OpcodeInfo& lhs, const OpcodeInfo& rhs) {
  if (lhs.opcode_ < rhs.opcode_) {
    return true;
  }
  if (lhs.opcode_ > rhs.opcode_) {
    return false;
  }
  if (lhs.kind_ < rhs.kind_) {
    return true;
  }
  if (lhs.kind_ > rhs.kind_) {
    return false;
  }
  if (lhs.data_ < rhs.data_) {
    return true;
  }
  if (lhs.data_ > rhs.data_) {
    return false;
  }
  return false;
}